

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_xref.cc
# Opt level: O0

int OBJ_find_sigid_algs(int signid,int *pdig_nid,int *ppkey_nid)

{
  ulong local_28;
  size_t i;
  int *out_pkey_nid_local;
  int *out_digest_nid_local;
  int sign_nid_local;
  
  local_28 = 0;
  while( true ) {
    if (0x11 < local_28) {
      return 0;
    }
    if (kTriples[local_28].sign_nid == signid) break;
    local_28 = local_28 + 1;
  }
  if (pdig_nid != (int *)0x0) {
    *pdig_nid = kTriples[local_28].digest_nid;
  }
  if (ppkey_nid != (int *)0x0) {
    *ppkey_nid = kTriples[local_28].pkey_nid;
  }
  return 1;
}

Assistant:

int OBJ_find_sigid_algs(int sign_nid, int *out_digest_nid, int *out_pkey_nid) {
  for (size_t i = 0; i < OPENSSL_ARRAY_SIZE(kTriples); i++) {
    if (kTriples[i].sign_nid == sign_nid) {
      if (out_digest_nid != NULL) {
        *out_digest_nid = kTriples[i].digest_nid;
      }
      if (out_pkey_nid != NULL) {
        *out_pkey_nid = kTriples[i].pkey_nid;
      }
      return 1;
    }
  }

  return 0;
}